

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::ReturnMeshFragments(ON_SubDHeap *this,ON_SubDFace *face)

{
  ON_SubDMeshFragment *pOVar1;
  bool bVar2;
  ON_SubDMeshFragment *next_fragment;
  ON_SubDMeshFragment *fragment;
  ON_SubDFace *face_local;
  ON_SubDHeap *this_local;
  
  if (face == (ON_SubDFace *)0x0) {
LAB_008f499e:
    this_local._7_1_ = true;
  }
  else {
    ON_SubDComponentBase::Internal_ClearSurfacePointFlag(&face->super_ON_SubDComponentBase);
    next_fragment = face->m_mesh_fragments;
    face->m_mesh_fragments = (ON_SubDMeshFragment *)0x0;
    do {
      if (next_fragment == (ON_SubDMeshFragment *)0x0) goto LAB_008f499e;
      if (face != next_fragment->m_face) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      pOVar1 = next_fragment->m_next_fragment;
      bVar2 = ReturnMeshFragment(this,next_fragment);
      next_fragment = pOVar1;
    } while (bVar2);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::ReturnMeshFragments(const ON_SubDFace * face)
{
  if (nullptr != face)
  {
    face->Internal_ClearSurfacePointFlag();
    ON_SubDMeshFragment* fragment = face->m_mesh_fragments;
    face->m_mesh_fragments = nullptr;
    while (nullptr != fragment)
    {
      if (face != fragment->m_face)
        return ON_SUBD_RETURN_ERROR(false);
      ON_SubDMeshFragment* next_fragment = fragment->m_next_fragment;
      if (false == ReturnMeshFragment(fragment))
        return false;
      fragment = next_fragment;
    }
  }
  return true;
}